

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int lx,int ly)

{
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int in_R8D;
  int in_stack_000002b0;
  int in_stack_000002b4;
  int in_stack_000002b8;
  int in_stack_000002bc;
  ToYa *in_stack_000002c0;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    TiledOutputFile::writeTile
              ((TiledOutputFile *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(int)((ulong)in_RDI >> 0x20)
               ,(int)in_RDI);
  }
  else {
    ToYa::writeTile(in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b4,
                    in_stack_000002b0);
  }
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->writeTile (dx, dy, lx, ly);
    }
    else
    {
        _outputFile->writeTile (dx, dy, lx, ly);
    }
}